

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.h
# Opt level: O3

float * __thiscall
Nova::Array_ND<float,_2>::operator()(Array_ND<float,_2> *this,Vector<int,_2,_true> *index)

{
  undefined8 uVar1;
  ulong uVar2;
  
  uVar1 = *(undefined8 *)(index->_data)._M_elems;
  uVar2 = (ulong)(((int)uVar1 - (int)*(undefined8 *)this) * *(int *)(this + 0x2c) +
                 ((int)((ulong)uVar1 >> 0x20) - (int)((ulong)*(undefined8 *)this >> 0x20)));
  if (uVar2 < (ulong)(*(long *)(this + 0x18) - *(long *)(this + 0x10) >> 2)) {
    return (float *)(*(long *)(this + 0x10) + uVar2 * 4);
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

Vector(const Vector& other)
        :_data(other._data)
    {}